

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  int iVar1;
  lua_State *L_00;
  char *in_RCX;
  lua_State *in_RDX;
  lua_State *in_RDI;
  char *in_R8;
  char *filename;
  luaL_Buffer msg;
  lua_State *filename_00;
  int idx;
  lua_State *in_stack_ffffffffffffdfb0;
  undefined4 in_stack_ffffffffffffdfb8;
  int in_stack_ffffffffffffdfbc;
  luaL_Buffer *in_stack_ffffffffffffdfc0;
  char *in_stack_ffffffffffffffc8;
  
  luaL_buffinit(in_RDI,(luaL_Buffer *)&stack0xffffffffffffdfb8);
  if (*in_RCX != '\0') {
    luaL_gsub(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffc8);
  }
  while( true ) {
    L_00 = (lua_State *)
           pushnexttemplate((lua_State *)
                            CONCAT44(in_stack_ffffffffffffdfbc,in_stack_ffffffffffffdfb8),
                            (char *)in_stack_ffffffffffffdfb0);
    if (L_00 == (lua_State *)0x0) {
      luaL_pushresult((luaL_Buffer *)0x13b86f);
      return (char *)0x0;
    }
    filename_00 = in_RDI;
    lua_tolstring((lua_State *)in_stack_ffffffffffffdfc0,in_stack_ffffffffffffdfbc,
                  (size_t *)in_stack_ffffffffffffdfb0);
    in_stack_ffffffffffffdfb0 = (lua_State *)luaL_gsub(L_00,in_RCX,in_R8,in_stack_ffffffffffffffc8);
    lua_remove(in_stack_ffffffffffffdfb0,(int)((ulong)filename_00 >> 0x20));
    iVar1 = readable((char *)filename_00);
    idx = (int)((ulong)filename_00 >> 0x20);
    if (iVar1 != 0) break;
    lua_pushfstring(in_RDI,"\n\tno file \'%s\'",in_stack_ffffffffffffdfb0);
    lua_remove(in_stack_ffffffffffffdfb0,idx);
    luaL_addvalue(in_stack_ffffffffffffdfc0);
  }
  return (char *)in_stack_ffffffffffffdfb0;
}

Assistant:

static const char *searchpath (lua_State *L, const char *name,
			       const char *path, const char *sep,
			       const char *dirsep)
{
  luaL_Buffer msg;  /* to build error message */
  luaL_buffinit(L, &msg);
  if (*sep != '\0')  /* non-empty separator? */
    name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
  while ((path = pushnexttemplate(L, path)) != NULL) {
    const char *filename = luaL_gsub(L, lua_tostring(L, -1),
				     LUA_PATH_MARK, name);
    lua_remove(L, -2);  /* remove path template */
    goto check_readable; /* suppress "unused label" warning */
check_readable:
    if (readable(filename))  /* does file exist and is readable? */
      return filename;  /* return that file name */
    lua_pushfstring(L, "\n\tno file " LUA_QS, filename);
#if LJ_TARGET_OSX || LJ_TARGET_IOS
    /* if *.dylib is missing, try *.so */
    size_t len = strlen(filename);
    if (len > 6 && strcmp(filename + len - 6, ".dylib") == 0) {
      luaL_addvalue(&msg);  /* concatenate error msg. entry */
      lua_pushlstring(L, filename, len - 6);
      filename = lua_pushfstring(L, "%s.so", lua_tostring(L, -1));
      lua_insert(L, -3); /* sink new filename below old one */
      lua_pop(L, 2);
      goto check_readable;
    }
#endif
    lua_remove(L, -2);  /* remove file name */
    luaL_addvalue(&msg);  /* concatenate error msg. entry */
  }
  luaL_pushresult(&msg);  /* create error message */
  return NULL;  /* not found */
}